

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O3

void Of_ManComputeBackward3(Of_Man_t *p)

{
  uint *puVar1;
  int *piVar2;
  int iVar3;
  Jf_Par_t *pJVar4;
  Gia_Obj_t *pGVar5;
  undefined8 uVar6;
  Of_Obj_t *pOVar7;
  void *pvVar8;
  int *piVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  uint *pCut;
  long lVar21;
  long lVar22;
  uint *pCut_00;
  
  iVar3 = p->pPars->nDelayLut1;
  Of_ManComputeOutputRequired(p,0);
  pJVar4 = p->pPars;
  pJVar4->Area = 0;
  pJVar4->Edge = 0;
  lVar21 = (long)p->pGia->nObjs;
  if (1 < lVar21) {
    do {
      if (p->pGia->nObjs < lVar21) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar5 = p->pGia->pObjs;
      if (pGVar5 == (Gia_Obj_t *)0x0) {
        return;
      }
      lVar22 = lVar21 + -1;
      uVar6 = *(undefined8 *)(pGVar5 + lVar22);
      uVar13 = (uint)uVar6;
      if ((~uVar13 & 0x1fffffff) != 0 && -1 < (int)uVar13) {
        pOVar7 = p->pObjs;
        iVar17 = pOVar7[lVar22].Required;
        if (((uVar13 & 0x1fffffff) == 0x1fffffff) ||
           ((uVar13 & 0x1fffffff) != ((uint)((ulong)uVar6 >> 0x20) & 0x1fffffff))) {
          if (pOVar7[lVar22].nRefs != 0) {
            uVar13 = pOVar7[lVar22].iCutH >> 0x10;
            if (((int)uVar13 < 0) || ((p->vPages).nSize <= (int)uVar13)) {
LAB_00790f43:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            iVar11 = Of_CutDeref_rec(p,(int *)((ulong)((pOVar7[lVar22].iCutH & 0xffffU) << 2) +
                                              (long)(p->vPages).pArray[uVar13]));
            if ((p->vCutSets).nSize < lVar21) {
LAB_00790f81:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar13 = (p->vCutSets).pArray[lVar22];
            uVar14 = (int)uVar13 >> 0x10;
            if (((int)uVar14 < 0) || ((p->vPages).nSize <= (int)uVar14)) goto LAB_00790f43;
            pvVar8 = (p->vPages).pArray[uVar14];
            uVar16 = (ulong)(uVar13 & 0xffff);
            uVar13 = *(uint *)((long)pvVar8 + uVar16 * 4);
            if ((int)uVar13 < 1) {
LAB_00790f62:
              __assert_fail("pCutMin != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                            ,0x500,"void Of_ManComputeBackward3(Of_Man_t *)");
            }
            puVar1 = (uint *)((long)pvVar8 + uVar16 * 4);
            pCut_00 = puVar1 + 1;
            iVar19 = 1000000000;
            iVar20 = 0;
            pCut = (uint *)0x0;
            do {
              uVar14 = *pCut_00 & 0x1f;
              if ((int)pCut_00[(ulong)uVar14 + 1] <= iVar17) {
                if ((p->vCutRefs).nSize != 0) {
                  __assert_fail("Vec_IntSize(&p->vCutRefs) == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                                ,0x440,"int Of_CutAreaDerefed2(Of_Man_t *, int *)");
                }
                iVar12 = Of_CutRef2_rec(p,(int *)pCut_00);
                lVar15 = (long)(p->vCutRefs).nSize;
                if (0 < lVar15) {
                  piVar9 = (p->vCutRefs).pArray;
                  pOVar7 = p->pObjs;
                  lVar18 = 0;
                  do {
                    piVar2 = &pOVar7[piVar9[lVar18]].nRefs;
                    *piVar2 = *piVar2 + -1;
                    lVar18 = lVar18 + 1;
                  } while (lVar15 != lVar18);
                }
                if (iVar12 < iVar19) {
                  pCut = pCut_00;
                }
                if (iVar12 <= iVar19) {
                  iVar19 = iVar12;
                }
                (p->vCutRefs).nSize = 0;
                uVar13 = *puVar1;
                uVar14 = *pCut_00 & 0x1f;
              }
              iVar20 = iVar20 + 1;
              pCut_00 = pCut_00 + (ulong)uVar14 + 4;
            } while (iVar20 < (int)uVar13);
            if (pCut == (uint *)0x0) goto LAB_00790f62;
            if ((p->vCutSets).nSize < lVar21) goto LAB_00790f81;
            if (pCut < puVar1 || (long)pCut - (long)puVar1 == 0) {
              __assert_fail("pCut > pCutSet",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                            ,0x6c,"int Of_CutHandle(int *, int *)");
            }
            pOVar7 = p->pObjs;
            pOVar7[lVar22].iCutH =
                 (int)((ulong)((long)pCut - (long)puVar1) >> 2) + (p->vCutSets).pArray[lVar22];
            uVar13 = *pCut;
            if ((uVar13 & 0x1f) != 0) {
              iVar17 = iVar17 - iVar3;
              uVar16 = 0;
              do {
                uVar14 = pCut[uVar16 + 1];
                if ((int)uVar14 < 0) {
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                ,0x12f,"int Abc_Lit2Var(int)");
                }
                if (uVar14 < 2) break;
                if (iVar17 < pOVar7[uVar14 >> 1].Required) {
                  pOVar7[uVar14 >> 1].Required = iVar17;
                  uVar13 = *pCut;
                }
                uVar16 = uVar16 + 1;
              } while (uVar16 < (uVar13 & 0x1f));
            }
            iVar17 = Of_CutRef_rec(p,(int *)pCut);
            if (iVar11 < iVar17) {
              __assert_fail("AreaAft <= AreaBef",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                            ,0x506,"void Of_ManComputeBackward3(Of_Man_t *)");
            }
            uVar13 = *pCut;
            pJVar4 = p->pPars;
            pJVar4->Area = pJVar4->Area + 1;
            pJVar4->Edge = (ulong)(uVar13 & 0x1f) + pJVar4->Edge;
          }
        }
        else {
          lVar15 = lVar22 - (ulong)(uVar13 & 0x1fffffff);
          if (iVar17 < pOVar7[lVar15].Required) {
            pOVar7[lVar15].Required = iVar17;
          }
        }
      }
      bVar10 = 2 < lVar21;
      lVar21 = lVar22;
    } while (bVar10);
  }
  return;
}

Assistant:

void Of_ManComputeBackward3( Of_Man_t * p )
{
    Gia_Obj_t * pObj; 
    int DelayLut1 = p->pPars->nDelayLut1;
    int i, k, iVar, * pList, * pCut, * pCutMin;
    int AreaBef = 0, AreaAft = 0;
    Of_ManComputeOutputRequired( p, 0 );
    // compute area and edges
    p->pPars->Area = p->pPars->Edge = 0;
    Gia_ManForEachAndReverse( p->pGia, pObj, i )
    {
        int CostMin, Cost, Required = Of_ObjRequired(p, i);
        if ( Gia_ObjIsBuf(pObj) )
        {
            int FaninId = Gia_ObjFaninId0(pObj, i);
            Of_ObjUpdateRequired( p, FaninId, Required );
            continue;
        }
        if ( !Of_ObjRefNum(p, i) )
            continue;
        // deref best cut
        AreaBef = Of_CutDeref_rec( p, Of_ObjCutBestP(p, i) );        
        // select the best cut
        pCutMin = NULL;
        CostMin = ABC_INFINITY;
        pList = Of_ObjCutSet( p, i );
        Of_SetForEachCut( pList, pCut, k )
        {
            if ( Of_CutDelay1(pCut) > Required )
                continue;
            Cost = Of_CutAreaDerefed2( p, pCut );
            if ( CostMin > Cost )
            {
                CostMin = Cost;
                pCutMin = pCut;
            }
        }
        // the cut is selected
        assert( pCutMin != NULL );
        Of_ObjSetCutBestP( p, pList, i, pCutMin );
        Of_CutForEachVar( pCutMin, iVar, k )
            Of_ObjUpdateRequired( p, iVar, Required - DelayLut1 );
        // ref best cut
        AreaAft = Of_CutRef_rec( p, pCutMin );
        assert( AreaAft <= AreaBef );
        // update parameters
        p->pPars->Edge += Of_CutSize(pCutMin);
        p->pPars->Area++;
    }
}